

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O2

void __thiscall Shell::TheoryAxioms::addDiscriminationAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  uint predicate;
  TermAlgebraConstructor *pTVar1;
  Term *pTVar2;
  TermList *pTVar3;
  uint i;
  uint uVar4;
  ulong uVar5;
  TermList elem;
  ulong uVar6;
  uint uVar7;
  ulong n;
  initializer_list<Kernel::Literal_*> lits;
  Array<Kernel::TermList> cases;
  TermStack args;
  TermStack variables;
  
  Lib::Stack<Kernel::TermList>::Stack
            (&args,(ulong)(*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff));
  elem._content = 1;
  for (uVar4 = 0; uVar4 < (*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff); uVar4 = uVar4 + 1) {
    Lib::Stack<Kernel::TermList>::push(&args,elem);
    elem._content = elem._content + 4;
  }
  Lib::Array<Kernel::TermList>::Array(&cases,(ulong)ta->_n);
  for (n = 0; uVar5 = (ulong)ta->_n, n < uVar5; n = n + 1) {
    pTVar1 = TermAlgebra::constructor(ta,(uint)n);
    Lib::Stack<Kernel::TermList>::Stack(&variables,&args);
    uVar4 = TermAlgebraConstructor::numTypeArguments(pTVar1);
    uVar6 = (ulong)uVar4;
    uVar5 = uVar6 * 4;
    while( true ) {
      uVar4 = TermAlgebraConstructor::arity(pTVar1);
      if (uVar4 <= uVar6) break;
      Lib::Stack<Kernel::TermList>::push(&variables,(TermList)((uVar5 & 0xffffffff) + 1));
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 4;
    }
    pTVar2 = Kernel::Term::create
                       (pTVar1->_functor,
                        (uint)((ulong)((long)variables._cursor - (long)variables._stack) >> 3),
                        variables._stack);
    pTVar3 = Lib::Array<Kernel::TermList>::operator[](&cases,n);
    pTVar3->_content = (uint64_t)pTVar2;
    Lib::Stack<Kernel::TermList>::~Stack(&variables);
  }
  for (uVar4 = 0; uVar4 < (uint)uVar5; uVar4 = uVar4 + 1) {
    pTVar1 = TermAlgebra::constructor(ta,uVar4);
    if (pTVar1->_hasDiscriminator == true) {
      for (uVar7 = 0; uVar7 < cases._capacity; uVar7 = uVar7 + 1) {
        pTVar3 = Lib::Array<Kernel::TermList>::operator[](&cases,(ulong)uVar7);
        Lib::Stack<Kernel::TermList>::push(&args,(TermList)pTVar3->_content);
        predicate = TermAlgebraConstructor::discriminator(pTVar1);
        variables._capacity =
             (size_t)Kernel::Literal::create
                               (predicate,
                                (uint)((ulong)((long)args._cursor - (long)args._stack) >> 3),
                                uVar4 == uVar7,args._stack);
        args._cursor = args._cursor + -1;
        lits._M_len = 1;
        lits._M_array = (iterator)&variables;
        addTheoryClauseFromLits(this,lits,TERM_ALGEBRA_DISCRIMINATION_AXIOM,0);
      }
    }
    uVar5 = (ulong)ta->_n;
  }
  Lib::Array<Kernel::TermList>::~Array(&cases);
  Lib::Stack<Kernel::TermList>::~Stack(&args);
  return;
}

Assistant:

void TheoryAxioms::addDiscriminationAxiom(TermAlgebra* ta) {
  TermStack args(ta->nTypeArgs());
  unsigned v = 0;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(v++,false));
  }
  Array<TermList> cases(ta->nConstructors());
  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    TermAlgebraConstructor* c = ta->constructor(i);

    TermStack variables = args;
    for (unsigned var = c->numTypeArguments(); var < c->arity(); var++) {
      variables.push(TermList(var, false));
    }

    TermList term(Term::create(c->functor(), (unsigned)variables.size(), variables.begin()));
    cases[i] = term;
  }

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    TermAlgebraConstructor* constructor = ta->constructor(i);

    if (!constructor->hasDiscriminator()) continue;

    for (unsigned c = 0; c < cases.size(); c++) {
      args.push(cases[c]);
      Literal* lit = Literal::create(constructor->discriminator(), args.size(), c == i, args.begin());
      args.pop();
      addTheoryClauseFromLits({lit}, InferenceRule::TERM_ALGEBRA_DISCRIMINATION_AXIOM,CHEAP);
    }
  }
}